

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O2

void pztopology::TPZTriangle::ComputeHCurlFaceDirections<Fad<double>>
               (TPZVec<Fad<double>_> *v1,TPZVec<Fad<double>_> *v2,int transformationId)

{
  long lVar1;
  REAL *val;
  
  val = fTangentVectors[transformationId * 2];
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x20) {
    Fad<double>::operator=<double,_nullptr>((Fad<double> *)((long)&v1->fStore->val_ + lVar1),val);
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)((long)&v2->fStore->val_ + lVar1),(double *)(val + 2));
    val = val + 1;
  }
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlFaceDirections(TPZVec<TVar> &v1, TPZVec<TVar> &v2, int transformationId)
    {
        for (auto i=0; i< Dimension; i++){
            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            v1[i] = fTangentVectors[2*transformationId][i];
            v2[i] = fTangentVectors[2*transformationId + 1][i];
        }//for
    }